

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *window,bool write)

{
  int iVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  byte in_SIL;
  long in_RDI;
  int n_5;
  int n_4;
  int n_3;
  int n_2;
  int n_1;
  int n;
  short *p;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  bVar3 = in_SIL & 1;
  if (bVar3 == 0) {
    if ((int)*(short *)(in_RDI + 0x208) != *(int *)(in_RDI + 0xc0)) {
      __assert_fail("*p == n && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad1,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x208) = (short)*(int *)(in_RDI + 0xc0);
  }
  if (bVar3 == 0) {
    if ((int)*(short *)(in_RDI + 0x20a) != *(int *)(in_RDI + 0x1f8)) {
      __assert_fail("*p == n && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad2,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x20a) = (short)*(int *)(in_RDI + 0x1f8);
  }
  iVar1 = (pIVar2->BeginPopupStack).Size;
  if (bVar3 == 0) {
    if (*(short *)(in_RDI + 0x20c) != iVar1) {
      __assert_fail("*p == n && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad6,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x20c) = (short)iVar1;
  }
  iVar1 = (pIVar2->ColorModifiers).Size;
  if (bVar3 == 0) {
    if (*(short *)(in_RDI + 0x20e) < iVar1) {
      __assert_fail("*p >= n && \"PushStyleColor/PopStyleColor Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad7,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x20e) = (short)iVar1;
  }
  iVar1 = (pIVar2->StyleModifiers).Size;
  if (bVar3 == 0) {
    if (*(short *)(in_RDI + 0x210) < iVar1) {
      __assert_fail("*p >= n && \"PushStyleVar/PopStyleVar Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad8,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x210) = (short)iVar1;
  }
  iVar1 = (pIVar2->FontStack).Size;
  if (bVar3 == 0) {
    if (*(short *)(in_RDI + 0x212) < iVar1) {
      __assert_fail("*p >= n && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ad9,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    *(short *)(in_RDI + 0x212) = (short)iVar1;
  }
  return;
}

Assistant:

static void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow* window, bool write)
{
    ImGuiContext& g = *GImGui;
    short* p = &window->DC.StackSizesBackup[0];

    // Window stacks
    // NOT checking: DC.ItemWidth, DC.AllowKeyboardFocus, DC.ButtonRepeat, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    { int n = window->IDStack.Size;       if (write) *p = (short)n; else IM_ASSERT(*p == n && "PushID/PopID or TreeNode/TreePop Mismatch!");   p++; }    // Too few or too many PopID()/TreePop()
    { int n = window->DC.GroupStack.Size; if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginGroup/EndGroup Mismatch!");                p++; }    // Too few or too many EndGroup()

    // Global stacks
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    { int n = g.BeginPopupStack.Size;     if (write) *p = (short)n; else IM_ASSERT(*p == n && "BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!"); p++; }// Too few or too many EndMenu()/EndPopup()
    { int n = g.ColorModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleColor/PopStyleColor Mismatch!");       p++; }    // Too few or too many PopStyleColor()
    { int n = g.StyleModifiers.Size;      if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushStyleVar/PopStyleVar Mismatch!");           p++; }    // Too few or too many PopStyleVar()
    { int n = g.FontStack.Size;           if (write) *p = (short)n; else IM_ASSERT(*p >= n && "PushFont/PopFont Mismatch!");                   p++; }    // Too few or too many PopFont()
    IM_ASSERT(p == window->DC.StackSizesBackup + IM_ARRAYSIZE(window->DC.StackSizesBackup));
}